

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

void FT_Outline_Transform(FT_Outline *outline,FT_Matrix *matrix)

{
  FT_Vector *vector;
  FT_Vector *pFVar1;
  
  if ((matrix != (FT_Matrix *)0x0 && outline != (FT_Outline *)0x0) && (0 < (long)outline->n_points))
  {
    vector = outline->points;
    pFVar1 = vector + outline->n_points;
    do {
      FT_Vector_Transform(vector,matrix);
      vector = vector + 1;
    } while (vector < pFVar1);
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Outline_Transform( const FT_Outline*  outline,
                        const FT_Matrix*   matrix )
  {
    FT_Vector*  vec;
    FT_Vector*  limit;


    if ( !outline || !matrix )
      return;

    vec   = outline->points;
    limit = vec + outline->n_points;

    for ( ; vec < limit; vec++ )
      FT_Vector_Transform( vec, matrix );
  }